

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O1

size_t TdokuSolverDpllTriadSimd
                 (char *puzzle,size_t limit,uint32_t configuration,char *solution,
                 size_t *num_guesses)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  undefined1 *puVar9;
  ulong uVar10;
  undefined1 *puVar11;
  uint uVar12;
  long lVar13;
  State *state;
  long lVar14;
  long lVar15;
  uint uVar16;
  char cVar17;
  undefined1 *puVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  char buf [736];
  Cells16 local_540;
  undefined1 local_520 [488];
  undefined8 auStack_338 [3];
  undefined1 auStack_320 [160];
  undefined8 auStack_280 [74];
  
  if (limit != 1 && configuration == 0) {
    (anonymous_namespace)::solver_none._488_8_ = 0;
    (anonymous_namespace)::solver_none._496_8_ = 0;
    cVar17 = puzzle[0x51];
    puVar11 = local_520 + 0x1e0;
    lVar13 = 0;
    do {
      auVar25 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])(auStack_320 + lVar13) = auVar25;
      auVar25 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])(local_520 + lVar13 + 0x1e0) = auVar25;
      lVar14 = 0x10;
      do {
        *(undefined8 *)(puVar11 + lVar14 + -0x10) = 0x1ff01ff01ff01ff;
        *(undefined8 *)((long)(puVar11 + lVar14 + -0x10) + 8) = 0x1ff01ff;
        *(undefined8 *)(puVar11 + lVar14) = 0;
        *(undefined8 *)((long)(puVar11 + lVar14) + 8) = 0;
        lVar14 = lVar14 + 0x20;
      } while (lVar14 != 0x70);
      lVar13 = lVar13 + 0x60;
      puVar11 = puVar11 + 0x60;
    } while (lVar13 != 0xc0);
    lVar13 = 0xc0;
    do {
      *(undefined8 *)(local_520 + lVar13 + 0x1e0) = 0x1ff01ff01ff01ff;
      *(undefined8 *)((long)auStack_338 + lVar13) = 0x1ff01ff01ff01ff;
      *(undefined8 *)((long)auStack_338 + lVar13 + 8) = 0x1ff01ff01ff01ff;
      *(undefined8 *)((long)auStack_338 + lVar13 + 0x10) = 0x1ff01ff01ff01ff;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x1e0);
    (anonymous_namespace)::solver_none._480_8_ = limit;
    if (cVar17 < '.') {
      bVar19 = anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<0>::InitVanillaByBand
                         (puzzle,(State *)(local_520 + 0x1e0));
    }
    else {
      bVar19 = anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<0>::InitPencilmarkByBox
                         (puzzle,(State *)(local_520 + 0x1e0));
    }
    if (bVar19 != false) {
      anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<0>::
      CountSolutionsConsistentWithPartialAssignment
                ((SolverDpllTriadSimd<0> *)(anonymous_namespace)::solver_none,
                 (State *)(local_520 + 0x1e0));
    }
    *num_guesses = (anonymous_namespace)::solver_none._496_8_;
    return (anonymous_namespace)::solver_none._488_8_;
  }
  (anonymous_namespace)::solver_last._488_8_ = 0;
  (anonymous_namespace)::solver_last._496_8_ = 0;
  cVar17 = puzzle[0x51];
  puVar11 = local_520;
  lVar13 = 0;
  do {
    auVar25 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    *(undefined1 (*) [64])(local_520 + lVar13 + 0x20) = auVar25;
    auVar25 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    *(undefined1 (*) [64])(local_520 + lVar13) = auVar25;
    lVar14 = 0x10;
    do {
      *(undefined8 *)(puVar11 + lVar14 + -0x10) = 0x1ff01ff01ff01ff;
      *(undefined8 *)((long)(puVar11 + lVar14 + -0x10) + 8) = 0x1ff01ff;
      *(undefined8 *)(puVar11 + lVar14) = 0;
      *(undefined8 *)((long)(puVar11 + lVar14) + 8) = 0;
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != 0x70);
    lVar13 = lVar13 + 0x60;
    puVar11 = puVar11 + 0x60;
  } while (lVar13 != 0xc0);
  lVar13 = 0xc0;
  do {
    *(undefined8 *)(local_520 + lVar13) = 0x1ff01ff01ff01ff;
    *(undefined8 *)(local_520 + lVar13 + 8) = 0x1ff01ff01ff01ff;
    *(undefined8 *)(local_520 + lVar13 + 0x10) = 0x1ff01ff01ff01ff;
    *(undefined8 *)(local_520 + lVar13 + 0x18) = 0x1ff01ff01ff01ff;
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0x1e0);
  (anonymous_namespace)::solver_last._480_8_ = limit;
  if (cVar17 < '.') {
    auVar23[8] = 0x2e;
    auVar23._0_8_ = 0x2e2e2e2e2e2e2e2e;
    auVar23[9] = 0x2e;
    auVar23[10] = 0x2e;
    auVar23[0xb] = 0x2e;
    auVar23[0xc] = 0x2e;
    auVar23[0xd] = 0x2e;
    auVar23[0xe] = 0x2e;
    auVar23[0xf] = 0x2e;
    auVar23[0x10] = 0x2e;
    auVar23[0x11] = 0x2e;
    auVar23[0x12] = 0x2e;
    auVar23[0x13] = 0x2e;
    auVar23[0x14] = 0x2e;
    auVar23[0x15] = 0x2e;
    auVar23[0x16] = 0x2e;
    auVar23[0x17] = 0x2e;
    auVar23[0x18] = 0x2e;
    auVar23[0x19] = 0x2e;
    auVar23[0x1a] = 0x2e;
    auVar23[0x1b] = 0x2e;
    auVar23[0x1c] = 0x2e;
    auVar23[0x1d] = 0x2e;
    auVar23[0x1e] = 0x2e;
    auVar23[0x1f] = 0x2e;
    uVar6 = vpcmpeqb_avx512vl(auVar23,*(undefined1 (*) [32])puzzle);
    uVar5 = vpcmpeqb_avx512vl(auVar23,*(undefined1 (*) [32])(puzzle + 0x20));
    uVar10 = CONCAT44((int)uVar5,(int)uVar6);
    if (uVar10 != 0xffffffffffffffff) {
      uVar10 = ~uVar10;
      do {
        lVar13 = 0;
        for (uVar3 = uVar10; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
          lVar13 = lVar13 + 1;
        }
        auVar23 = vandnps_avx(*(undefined1 (*) [32])
                               ((anonymous_namespace)::tables +
                               (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1905] *
                               0x20 + ((long)puzzle[lVar13] + -0x31) * 0x200),
                              *(undefined1 (*) [32])
                               (local_520 +
                               (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1902] *
                               0x20 + 0xc0));
        *(undefined1 (*) [32])
         (local_520 + (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1902] * 0x20 + 0xc0)
             = auVar23;
        bVar1 = (anonymous_namespace)::tables[lVar13 * 6 + 0x1901];
        auVar20 = vpbroadcastw_avx512vl();
        bVar2 = (anonymous_namespace)::tables[lVar13 * 6 + 0x1900];
        lVar14 = (ulong)bVar2 * 0x20;
        auVar21 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                       ((ulong)(byte)(anonymous_namespace)::tables
                                                     [lVar13 * 6 + 0x1903] * 0x10 +
                                       (ulong)bVar1 * 0x40 + 0x111440),auVar20,
                                      *(undefined1 (*) [16])(local_520 + lVar14 + 0x10),0xea);
        *(undefined1 (*) [16])(local_520 + lVar14 + 0x10) = auVar21;
        lVar14 = (ulong)bVar1 * 0x20;
        auVar20 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                       ((ulong)(byte)(anonymous_namespace)::tables
                                                     [lVar13 * 6 + 0x1904] * 0x10 +
                                       (ulong)bVar2 * 0x40 + 0x111440),auVar20,
                                      *(undefined1 (*) [16])(local_520 + lVar14 + 0x70),0xea);
        *(undefined1 (*) [16])(local_520 + lVar14 + 0x70) = auVar20;
        uVar10 = uVar10 - 1 & uVar10;
      } while (uVar10 != 0);
    }
    auVar20[8] = 0x2e;
    auVar20._0_8_ = 0x2e2e2e2e2e2e2e2e;
    auVar20[9] = 0x2e;
    auVar20[10] = 0x2e;
    auVar20[0xb] = 0x2e;
    auVar20[0xc] = 0x2e;
    auVar20[0xd] = 0x2e;
    auVar20[0xe] = 0x2e;
    auVar20[0xf] = 0x2e;
    uVar6 = vpcmpeqb_avx512vl(auVar20,*(undefined1 (*) [16])(puzzle + 0x40));
    if ((short)uVar6 != -1) {
      uVar8 = ~(uint)uVar6 & 0xffff;
      do {
        uVar12 = 0;
        for (uVar16 = uVar8; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x80000000) {
          uVar12 = uVar12 + 1;
        }
        lVar13 = (ulong)uVar12 + 0x40;
        auVar23 = vandnps_avx(*(undefined1 (*) [32])
                               ((anonymous_namespace)::tables +
                               (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1905] *
                               0x20 + ((long)puzzle[(ulong)uVar12 + 0x40] + -0x31) * 0x200),
                              *(undefined1 (*) [32])
                               (local_520 +
                               (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1902] *
                               0x20 + 0xc0));
        *(undefined1 (*) [32])
         (local_520 + (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1902] * 0x20 + 0xc0)
             = auVar23;
        bVar1 = (anonymous_namespace)::tables[lVar13 * 6 + 0x1901];
        auVar20 = vpbroadcastw_avx512vl();
        bVar2 = (anonymous_namespace)::tables[lVar13 * 6 + 0x1900];
        lVar14 = (ulong)bVar2 * 0x20;
        auVar21 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                       ((ulong)(byte)(anonymous_namespace)::tables
                                                     [lVar13 * 6 + 0x1903] * 0x10 +
                                       (ulong)bVar1 * 0x40 + 0x111440),auVar20,
                                      *(undefined1 (*) [16])(local_520 + lVar14 + 0x10),0xea);
        *(undefined1 (*) [16])(local_520 + lVar14 + 0x10) = auVar21;
        lVar14 = (ulong)bVar1 * 0x20;
        auVar20 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                       ((ulong)(byte)(anonymous_namespace)::tables
                                                     [lVar13 * 6 + 0x1904] * 0x10 +
                                       (ulong)bVar2 * 0x40 + 0x111440),auVar20,
                                      *(undefined1 (*) [16])(local_520 + lVar14 + 0x70),0xea);
        *(undefined1 (*) [16])(local_520 + lVar14 + 0x70) = auVar20;
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
    }
    if ((long)puzzle[0x50] != 0x2e) {
      auVar23 = vandnps_avx(*(undefined1 (*) [32])
                             ((anonymous_namespace)::tables +
                             (ulong)(anonymous_namespace)::tables[0x1ae5] * 0x20 +
                             ((long)puzzle[0x50] + -0x31) * 0x200),
                            *(undefined1 (*) [32])
                             (local_520 + (ulong)(anonymous_namespace)::tables[0x1ae2] * 0x20 + 0xc0
                             ));
      *(undefined1 (*) [32])(local_520 + (ulong)(anonymous_namespace)::tables[0x1ae2] * 0x20 + 0xc0)
           = auVar23;
      auVar20 = vpbroadcastw_avx512vl();
      auVar21 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                     ((ulong)(anonymous_namespace)::tables[0x1ae3] * 0x10 +
                                     (ulong)(anonymous_namespace)::tables[0x1ae1] * 0x40 + 0x111440)
                                    ,auVar20,*(undefined1 (*) [16])
                                              (local_520 +
                                              (ulong)(anonymous_namespace)::tables[0x1ae0] * 0x20 +
                                              0x10),0xea);
      *(undefined1 (*) [16])(local_520 + (ulong)(anonymous_namespace)::tables[0x1ae0] * 0x20 + 0x10)
           = auVar21;
      auVar20 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                     ((ulong)(anonymous_namespace)::tables[0x1ae4] * 0x10 +
                                     (ulong)(anonymous_namespace)::tables[0x1ae0] * 0x40 + 0x111440)
                                    ,auVar20,*(undefined1 (*) [16])
                                              (local_520 +
                                              (ulong)(anonymous_namespace)::tables[0x1ae1] * 0x20 +
                                              0x70),0xea);
      *(undefined1 (*) [16])(local_520 + (ulong)(anonymous_namespace)::tables[0x1ae1] * 0x20 + 0x70)
           = auVar20;
    }
    bVar19 = anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<1>::BandEliminate<0>
                       ((State *)local_520,0,1);
    if ((((!bVar19) ||
         (bVar19 = anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<1>::BandEliminate<1>
                             ((State *)local_520,0,1), !bVar19)) ||
        (bVar19 = anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<1>::BandEliminate<0>
                            ((State *)local_520,1,2), !bVar19)) ||
       ((bVar19 = anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<1>::BandEliminate<1>
                            ((State *)local_520,1,2), !bVar19 ||
        (bVar19 = anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<1>::BandEliminate<0>
                            ((State *)local_520,2,0), !bVar19)))) goto LAB_001075be;
    state = (State *)0x2;
    bVar19 = anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<1>::BandEliminate<1>
                       ((State *)local_520,2,0);
  }
  else {
    puVar11 = local_520 + 0x1e0;
    memcpy(puVar11,puzzle,0x2d9);
    uVar10 = 0;
    auVar25 = ZEXT1664(CONCAT115(0x2e,CONCAT114(0x2e,CONCAT113(0x2e,CONCAT112(0x2e,CONCAT111(0x2e,
                                                  CONCAT110(0x2e,CONCAT19(0x2e,CONCAT18(0x2e,
                                                  0x2e2e2e2e2e2e2e2e)))))))));
    bVar19 = false;
    do {
      lVar13 = 0;
      puVar18 = puVar11;
      do {
        uVar8 = 0;
        lVar14 = 0;
        auVar24 = ZEXT3264(CONCAT230(0x1ff,CONCAT228(0x1ff,CONCAT226(0x1ff,CONCAT224(0x1ff,CONCAT222
                                                  (0x1ff,CONCAT220(0x1ff,CONCAT218(0x1ff,CONCAT216(
                                                  0x1ff,CONCAT214(0x1ff,CONCAT212(0x1ff,CONCAT210(
                                                  0x1ff,CONCAT28(0x1ff,0x1ff01ff01ff01ff))))))))))))
                          );
        puVar9 = puVar18;
        do {
          lVar15 = 0;
          uVar12 = uVar8;
          do {
            if (0xf < uVar12) goto LAB_00106f29;
            uVar6 = vpcmpb_avx512vl(auVar25._0_16_,*(undefined1 (*) [16])(puVar9 + lVar15),4);
            uVar16 = (uint)uVar6 & 0x1ff;
            auVar20 = auVar24._0_16_;
            auVar23 = auVar24._0_32_;
            switch(uVar12) {
            case 0:
              auVar20 = vpinsrw_avx(auVar20,uVar16,0);
              auVar22 = ZEXT1632(auVar20);
              break;
            case 1:
              auVar20 = vpinsrw_avx(auVar20,uVar16,1);
              auVar22 = ZEXT1632(auVar20);
              break;
            case 2:
              auVar20 = vpinsrw_avx(auVar20,uVar16,2);
              auVar22 = ZEXT1632(auVar20);
              break;
            case 3:
              auVar20 = vpinsrw_avx(auVar20,uVar16,3);
              auVar22 = ZEXT1632(auVar20);
              break;
            case 4:
              auVar20 = vpinsrw_avx(auVar20,uVar16,4);
              auVar22 = ZEXT1632(auVar20);
              break;
            case 5:
              auVar20 = vpinsrw_avx(auVar20,uVar16,5);
              auVar22 = ZEXT1632(auVar20);
              break;
            case 6:
              auVar20 = vpinsrw_avx(auVar20,uVar16,6);
              auVar22 = ZEXT1632(auVar20);
              break;
            case 7:
              auVar20 = vpinsrw_avx(auVar20,uVar16,7);
              auVar22 = ZEXT1632(auVar20);
              break;
            case 8:
              auVar22 = vpbroadcastw_avx512vl();
              auVar22 = vpblendw_avx2(auVar23,auVar22,1);
              goto LAB_00106f23;
            case 9:
              auVar22 = vpbroadcastw_avx512vl();
              auVar22 = vpblendw_avx2(auVar23,auVar22,2);
              goto LAB_00106f23;
            case 10:
              auVar22 = vpbroadcastw_avx512vl();
              auVar22 = vpblendw_avx2(auVar23,auVar22,4);
              goto LAB_00106f23;
            case 0xb:
              auVar22 = vpbroadcastw_avx512vl();
              auVar22 = vpblendw_avx2(auVar23,auVar22,8);
              goto LAB_00106f23;
            case 0xc:
              auVar22 = vpbroadcastw_avx512vl();
              auVar22 = vpblendw_avx2(auVar23,auVar22,0x10);
              goto LAB_00106f23;
            case 0xd:
              auVar22 = vpbroadcastw_avx512vl();
              auVar22 = vpblendw_avx2(auVar23,auVar22,0x20);
              goto LAB_00106f23;
            case 0xe:
              auVar22 = vpbroadcastw_avx512vl();
              auVar22 = vpblendw_avx2(auVar23,auVar22,0x40);
              goto LAB_00106f23;
            case 0xf:
              auVar22 = vpbroadcastw_avx512vl();
              auVar22 = vpblendw_avx2(auVar23,auVar22,0x80);
LAB_00106f23:
              auVar23 = vpblendd_avx2(auVar23,auVar22,0xf0);
              auVar24 = ZEXT3264(auVar23);
              goto LAB_00106f29;
            }
            auVar23 = vpblendd_avx2(auVar23,auVar22,0xf);
            auVar24 = ZEXT3264(auVar23);
LAB_00106f29:
            lVar15 = lVar15 + 9;
            uVar12 = uVar12 + 1;
          } while (lVar15 != 0x1b);
          lVar14 = lVar14 + 1;
          uVar8 = uVar8 + 4;
          puVar9 = puVar9 + 0x51;
        } while (lVar14 != 3);
        local_540.vec = auVar24._0_32_;
        uVar8 = (int)lVar13 + (int)uVar10 * 3;
        state = (State *)(ulong)uVar8;
        bVar7 = anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<1>::BoxRestrict<0>
                          ((State *)local_520,uVar8,&local_540);
        if (!bVar7) goto joined_r0x00107407;
        lVar13 = lVar13 + 1;
        puVar18 = puVar18 + 0x1b;
        auVar25 = ZEXT1664(CONCAT115(0x2e,CONCAT114(0x2e,CONCAT113(0x2e,CONCAT112(0x2e,CONCAT111(
                                                  0x2e,CONCAT110(0x2e,CONCAT19(0x2e,CONCAT18(0x2e,
                                                  0x2e2e2e2e2e2e2e2e)))))))));
      } while (lVar13 != 3);
      bVar19 = 1 < uVar10;
      uVar10 = uVar10 + 1;
      puVar11 = puVar11 + 0xf3;
    } while (uVar10 != 3);
  }
joined_r0x00107407:
  if (bVar19) {
    anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<1>::CountSolutionsConsistentWithPartialAssignment
              ((SolverDpllTriadSimd<1> *)local_520,state);
    lVar13 = 0;
    do {
      uVar10 = *(ulong *)((anonymous_namespace)::solver_last + lVar13 * 8 + 0xc0);
      uVar3 = *(ulong *)((anonymous_namespace)::solver_last + lVar13 * 8 + 200);
      uVar4 = *(ulong *)((anonymous_namespace)::solver_last + lVar13 * 8 + 0xd0);
      lVar14 = (long)*(int *)((anonymous_namespace)::tables + lVar13 + 0x18dc) * 3 +
               (long)*(int *)((anonymous_namespace)::tables + lVar13 + 0x18b8) * 0x1b;
      cVar17 = '\0';
      for (uVar8 = (uint)uVar10; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
        cVar17 = cVar17 + '\x01';
      }
      cVar17 = cVar17 + '1';
      if ((uint)uVar10 == 0) {
        cVar17 = '0';
      }
      solution[lVar14] = cVar17;
      cVar17 = '\0';
      uVar12 = (uint)(uVar10 >> 0x10);
      for (uVar8 = uVar12; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
        cVar17 = cVar17 + '\x01';
      }
      cVar17 = cVar17 + '1';
      if (uVar12 == 0) {
        cVar17 = '0';
      }
      solution[lVar14 + 1] = cVar17;
      cVar17 = '\0';
      for (uVar8 = (uint)(uVar10 >> 0x20); (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
        cVar17 = cVar17 + '\x01';
      }
      cVar17 = cVar17 + '1';
      if (uVar10 >> 0x20 == 0) {
        cVar17 = '0';
      }
      solution[lVar14 + 2] = cVar17;
      cVar17 = '\0';
      for (uVar8 = (uint)uVar3; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
        cVar17 = cVar17 + '\x01';
      }
      cVar17 = cVar17 + '1';
      if ((uint)uVar3 == 0) {
        cVar17 = '0';
      }
      solution[lVar14 + 9] = cVar17;
      cVar17 = '\0';
      uVar12 = (uint)(uVar3 >> 0x10);
      for (uVar8 = uVar12; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
        cVar17 = cVar17 + '\x01';
      }
      cVar17 = cVar17 + '1';
      if (uVar12 == 0) {
        cVar17 = '0';
      }
      solution[lVar14 + 10] = cVar17;
      cVar17 = '\0';
      for (uVar8 = (uint)(uVar3 >> 0x20); (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
        cVar17 = cVar17 + '\x01';
      }
      cVar17 = cVar17 + '1';
      if (uVar3 >> 0x20 == 0) {
        cVar17 = '0';
      }
      solution[lVar14 + 0xb] = cVar17;
      cVar17 = '\0';
      for (uVar8 = (uint)uVar4; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
        cVar17 = cVar17 + '\x01';
      }
      cVar17 = cVar17 + '1';
      if ((uint)uVar4 == 0) {
        cVar17 = '0';
      }
      solution[lVar14 + 0x12] = cVar17;
      cVar17 = '\0';
      uVar12 = (uint)(uVar4 >> 0x10);
      for (uVar8 = uVar12; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
        cVar17 = cVar17 + '\x01';
      }
      cVar17 = cVar17 + '1';
      if (uVar12 == 0) {
        cVar17 = '0';
      }
      solution[lVar14 + 0x13] = cVar17;
      cVar17 = '\0';
      for (uVar8 = (uint)(uVar4 >> 0x20); (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
        cVar17 = cVar17 + '\x01';
      }
      cVar17 = cVar17 + '1';
      if (uVar4 >> 0x20 == 0) {
        cVar17 = '0';
      }
      solution[lVar14 + 0x14] = cVar17;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x24);
  }
LAB_001075be:
  *num_guesses = (anonymous_namespace)::solver_last._496_8_;
  return (anonymous_namespace)::solver_last._488_8_;
}

Assistant:

size_t TdokuSolverDpllTriadSimd(const char *puzzle, size_t limit,
                                uint32_t configuration,
                                char *solution, size_t *num_guesses) {
    bool return_last = limit == 1 || configuration > 0;
    if (return_last) {
        return solver_last.SolveSudoku(puzzle, limit, solution, num_guesses);
    } else {
        return solver_none.SolveSudoku(puzzle, limit, solution, num_guesses);
    }
}